

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_replaceRangeCString_success_indexAndRangeBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"0123",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  bVar1 = AString_replaceRangeCString(&string,4,0x29a,"45",2);
  if (bVar1 == false) {
    pcVar6 = "Assertion \'AString_replaceRangeCString(&string, 4, 666, \"45\", 2)\' failed";
    iVar2 = 0x632;
LAB_00138863:
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar6,0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x632);
  if (string.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x633);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      pcVar6 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (string).buffer != NULL";
      pcVar5 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x633);
      pcVar6 = string.buffer;
      if (string.buffer == (char *)0x0) {
        string.size = 0x16819b;
        pcVar6 = "(null)";
      }
      else {
        iVar2 = strcmp("012345",string.buffer);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x633);
          if (string.size != 6) {
            pcVar6 = "strlen(\"012345\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).size == strlen(\"012345\")";
            pcVar5 = "(string).size";
            goto LAB_00138808;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x633);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            pcVar6 = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar5 = "private_ACUtilsTest_AString_reallocCount";
            iVar2 = 0x634;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_001389a5;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x634);
          bVar1 = AString_replaceRangeCString(&string,0x29a,0x2a,"67",2);
          if (bVar1 == false) {
            pcVar6 = "Assertion \'AString_replaceRangeCString(&string, 666, 42, \"67\", 2)\' failed"
            ;
            iVar2 = 0x635;
            goto LAB_00138863;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x635);
          if (string.capacity == 8) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x636);
            if (string.buffer == (char *)0x0) {
              string.size = 0;
              pcVar6 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar4 = "(void*) (string).buffer != NULL";
              pcVar5 = "(void*) (string).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x636);
              pcVar6 = string.buffer;
              if (string.buffer == (char *)0x0) {
                pcVar6 = "(null)";
                string.size = 0x16819b;
              }
              else {
                iVar2 = strcmp("01234567",string.buffer);
                if (iVar2 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x636);
                  if (string.size == 8) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x636);
                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x637);
                      (*string.deallocator)(string.buffer);
                      return;
                    }
                    pcVar6 = "(0)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar5 = "private_ACUtilsTest_AString_reallocCount";
                    iVar2 = 0x637;
                    string.size = private_ACUtilsTest_AString_reallocCount;
                    goto LAB_001389a5;
                  }
                  pcVar6 = "strlen(\"01234567\")";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar4 = "(string).size == strlen(\"01234567\")";
                  pcVar5 = "(string).size";
                  goto LAB_001389a0;
                }
                string.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar4 = "(string).buffer == (\"01234567\")";
              pcVar5 = "(string).buffer";
            }
          }
          else {
            pcVar6 = "(8)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).capacity == (8)";
            pcVar5 = "(string).capacity";
            string.size = string.capacity;
          }
LAB_001389a0:
          iVar2 = 0x636;
          goto LAB_001389a5;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(string).buffer == (\"012345\")";
      pcVar5 = "(string).buffer";
    }
  }
  else {
    pcVar6 = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).capacity == (8)";
    pcVar5 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_00138808:
  iVar2 = 0x633;
LAB_001389a5:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar4,pcVar5,string.size,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRangeCString_success_indexAndRangeBeyondSize)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("0123", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 4, 666, "45", 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012345", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 666, 42, "67", 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}